

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_metric_set(REF_NODE ref_node,REF_INT node,REF_DBL *m)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL log_m [6];
  int local_2c;
  REF_INT i;
  REF_DBL *m_local;
  REF_INT node_local;
  REF_NODE ref_node_local;
  
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    ref_node->real[local_2c + 3 + node * 0xf] = m[local_2c];
  }
  ref_node_local._4_4_ = ref_matrix_log_m(m,(REF_DBL *)&stack0xffffffffffffff98);
  if (ref_node_local._4_4_ == 0) {
    for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
      ref_node->real[local_2c + 9 + node * 0xf] = log_m[(long)local_2c + -1];
    }
    ref_node_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x520,
           "ref_node_metric_set",(ulong)ref_node_local._4_4_,"exp");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_metric_set(REF_NODE ref_node, REF_INT node,
                                       REF_DBL *m) {
  REF_INT i;
  REF_DBL log_m[6];
  for (i = 0; i < 6; i++) {
    ((ref_node)->real[(i + 3) + REF_NODE_REAL_PER * (node)]) = m[i];
  }
  RSS(ref_matrix_log_m(m, log_m), "exp");
  for (i = 0; i < 6; i++) {
    ((ref_node)->real[(i + 9) + REF_NODE_REAL_PER * (node)]) = log_m[i];
  }
  return REF_SUCCESS;
}